

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O1

UBool icu_63::LocaleUtility::isFallbackOf(UnicodeString *root,UnicodeString *child)

{
  ushort uVar1;
  short sVar2;
  short sVar3;
  int32_t iVar4;
  int srcLength;
  uint uVar5;
  int srcStart;
  uint uVar6;
  char16_t *pcVar7;
  int iVar8;
  
  uVar1 = (root->fUnion).fStackFields.fLengthAndFlags;
  sVar2 = (child->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar4 = (child->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar2 >> 5;
  }
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      iVar8 = (root->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)(short)uVar1 >> 5;
    }
    srcStart = 0;
    if (iVar8 < 0) {
      srcStart = iVar8;
    }
    srcLength = iVar8 - srcStart;
    if (iVar8 <= iVar8 - srcStart) {
      srcLength = iVar8;
    }
    if (iVar8 < 0) {
      srcLength = 0;
    }
    if (srcLength < 1) {
      return '\0';
    }
    if ((uVar1 & 2) == 0) {
      pcVar7 = (root->fUnion).fFields.fArray;
    }
    else {
      pcVar7 = (root->fUnion).fStackFields.fBuffer;
    }
    iVar4 = UnicodeString::indexOf(child,pcVar7,srcStart,srcLength,0,iVar4);
    if (iVar4 != 0) {
      return '\0';
    }
    sVar2 = (child->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      uVar6 = (child->fUnion).fFields.fLength;
    }
    else {
      uVar6 = (int)sVar2 >> 5;
    }
    sVar3 = (root->fUnion).fStackFields.fLengthAndFlags;
    if (sVar3 < 0) {
      uVar5 = (root->fUnion).fFields.fLength;
    }
    else {
      uVar5 = (int)sVar3 >> 5;
    }
    if (uVar6 == uVar5) {
      return '\x01';
    }
    if (uVar5 < uVar6) {
      if (((int)sVar2 & 2U) == 0) {
        pcVar7 = (child->fUnion).fFields.fArray;
      }
      else {
        pcVar7 = (char16_t *)((long)&child->fUnion + 2);
      }
      return pcVar7[(int)uVar5] == L'_';
    }
  }
  return '\0';
}

Assistant:

UBool
LocaleUtility::isFallbackOf(const UnicodeString& root, const UnicodeString& child)
{
    return child.indexOf(root) == 0 &&
      (child.length() == root.length() ||
       child.charAt(root.length()) == UNDERSCORE_CHAR);
}